

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O0

void __thiscall YAML::Scanner::ScanDocEnd(Scanner *this)

{
  Stream *in_RDI;
  Mark MVar1;
  Mark mark;
  Scanner *in_stack_ffffffffffffff60;
  Stream *this_00;
  Token *in_stack_ffffffffffffff70;
  undefined1 local_80 [88];
  Mark local_28;
  undefined8 local_18;
  int local_10;
  
  PopAllIndents(in_stack_ffffffffffffff60);
  PopAllSimpleKeys(in_stack_ffffffffffffff60);
  in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3a = 0;
  in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3b = 0;
  MVar1 = YAML::Stream::mark(in_RDI);
  local_28.column = MVar1.column;
  local_10 = local_28.column;
  local_28._0_8_ = MVar1._0_8_;
  local_18._0_4_ = local_28.pos;
  local_18._4_4_ = local_28.line;
  local_28 = MVar1;
  YAML::Stream::eat(&in_stack_ffffffffffffff60->INPUT,(int)((ulong)in_RDI >> 0x20));
  this_00 = in_RDI + 1;
  Token::Token(in_stack_ffffffffffffff70,(TYPE)((ulong)local_80 >> 0x20),(Mark *)this_00);
  std::queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_>::push
            ((queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_> *)this_00,
             (value_type *)in_RDI);
  Token::~Token((Token *)this_00);
  return;
}

Assistant:

void Scanner::ScanDocEnd() {
  PopAllIndents();
  PopAllSimpleKeys();
  m_simpleKeyAllowed = false;
  m_canBeJSONFlow = false;

  // eat
  Mark mark = INPUT.mark();
  INPUT.eat(3);
  m_tokens.push(Token(Token::DOC_END, mark));
}